

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
          *this,WebSocketResponse *value)

{
  WebSocketResponse *value_00;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_1b8;
  WebSocketResponse *local_18;
  WebSocketResponse *value_local;
  AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (WebSocketResponse *)this;
    value_00 = mv<kj::HttpClient::WebSocketResponse>(value);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=(&this->result,&local_1b8);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }